

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_parse.c
# Opt level: O0

void expr_toreg_nobranch(FuncState *fs,ExpDesc *e,BCReg reg)

{
  anon_union_8_3_2ce71dea_for_u aVar1;
  BCReg BVar2;
  int iVar3;
  int32_t k;
  lua_Number n;
  BCIns ins;
  BCReg reg_local;
  ExpDesc *e_local;
  FuncState *fs_local;
  
  expr_discharge(fs,e);
  if (e->k == VKSTR) {
    BVar2 = const_str(fs,e);
    n._0_4_ = reg << 8 | 0x27 | BVar2 << 0x10;
  }
  else if (e->k == VKLAST) {
    aVar1 = e->u;
    iVar3 = (int)(double)aVar1;
    if (((iVar3 != (short)iVar3) || ((double)aVar1 != (double)iVar3)) ||
       (NAN((double)aVar1) || NAN((double)iVar3))) {
      BVar2 = const_num(fs,e);
      n._0_4_ = reg << 8 | 0x2a | BVar2 << 0x10;
    }
    else {
      n._0_4_ = reg << 8 | 0x29 | iVar3 << 0x10;
    }
  }
  else if (e->k == VKCDATA) {
    fs->flags = fs->flags | 4;
    BVar2 = const_gc(fs,(GCobj *)((ulong)(e->u).sval & 0x7fffffffffff),0xfffffff5);
    n._0_4_ = reg << 8 | 0x28 | BVar2 << 0x10;
  }
  else {
    if (e->k == VRELOCABLE) {
      *(char *)((long)&fs->bcbase[(e->u).s.info].ins + 1) = (char)reg;
      goto LAB_001382b9;
    }
    if (e->k == VNONRELOC) {
      if (reg == (e->u).s.info) goto LAB_001382b9;
      n._0_4_ = reg << 8 | 0x12 | (e->u).s.info << 0x10;
    }
    else {
      if (e->k == VKNIL) {
        bcemit_nil(fs,reg,1);
        goto LAB_001382b9;
      }
      if (VKTRUE < e->k) {
        return;
      }
      n._0_4_ = reg << 8 | 0x2b | e->k << 0x10;
    }
  }
  bcemit_INS(fs,n._0_4_);
LAB_001382b9:
  (e->u).s.info = reg;
  e->k = VNONRELOC;
  return;
}

Assistant:

static void expr_toreg_nobranch(FuncState *fs, ExpDesc *e, BCReg reg)
{
  BCIns ins;
  expr_discharge(fs, e);
  if (e->k == VKSTR) {
    ins = BCINS_AD(BC_KSTR, reg, const_str(fs, e));
  } else if (e->k == VKNUM) {
#if LJ_DUALNUM
    cTValue *tv = expr_numtv(e);
    if (tvisint(tv) && checki16(intV(tv)))
      ins = BCINS_AD(BC_KSHORT, reg, (BCReg)(uint16_t)intV(tv));
    else
#else
    lua_Number n = expr_numberV(e);
    int32_t k = lj_num2int(n);
    if (checki16(k) && n == (lua_Number)k)
      ins = BCINS_AD(BC_KSHORT, reg, (BCReg)(uint16_t)k);
    else
#endif
      ins = BCINS_AD(BC_KNUM, reg, const_num(fs, e));
#if LJ_HASFFI
  } else if (e->k == VKCDATA) {
    fs->flags |= PROTO_FFI;
    ins = BCINS_AD(BC_KCDATA, reg,
		   const_gc(fs, obj2gco(cdataV(&e->u.nval)), LJ_TCDATA));
#endif
  } else if (e->k == VRELOCABLE) {
    setbc_a(bcptr(fs, e), reg);
    goto noins;
  } else if (e->k == VNONRELOC) {
    if (reg == e->u.s.info)
      goto noins;
    ins = BCINS_AD(BC_MOV, reg, e->u.s.info);
  } else if (e->k == VKNIL) {
    bcemit_nil(fs, reg, 1);
    goto noins;
  } else if (e->k <= VKTRUE) {
    ins = BCINS_AD(BC_KPRI, reg, const_pri(e));
  } else {
    lj_assertFS(e->k == VVOID || e->k == VJMP, "bad expr type %d", e->k);
    return;
  }
  bcemit_INS(fs, ins);
noins:
  e->u.s.info = reg;
  e->k = VNONRELOC;
}